

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::stopRead(TcpConnection *this)

{
  EventLoop *this_00;
  _Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()> local_50;
  Functor local_38;
  
  this_00 = this->m_loop;
  local_50._M_f = (offset_in_TcpConnection_to_subr)stopReadInLoop;
  local_50._8_8_ = 0;
  local_50._M_bound_args.super__Tuple_impl<0UL,_sznet::net::TcpConnection_*>.
  super__Head_base<0UL,_sznet::net::TcpConnection_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::TcpConnection_*>)
       (_Tuple_impl<0UL,_sznet::net::TcpConnection_*>)this;
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*))()>,void>
            ((function<void()> *)&local_38,&local_50);
  EventLoop::runInLoop(this_00,&local_38);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  return;
}

Assistant:

void TcpConnection::stopRead()
{
	m_loop->runInLoop(std::bind(&TcpConnection::stopReadInLoop, this));
}